

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# upd7759.c
# Opt level: O1

void upd7759_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  char cVar1;
  short sVar2;
  int iVar3;
  DEV_SMPL *pDVar4;
  DEV_SMPL *pDVar5;
  bool bVar6;
  upd7759_state *chip;
  uint uVar7;
  uint uVar8;
  size_t __n;
  ulong uVar9;
  int iVar10;
  uint uVar11;
  
  uVar9 = 0;
  sVar2 = 0;
  if (*(char *)((long)param + 0x61) == '\0') {
    sVar2 = *(short *)((long)param + 0x42);
  }
  uVar11 = *(uint *)((long)param + 0x24);
  uVar7 = *(uint *)((long)param + 0xc);
  pDVar4 = *outputs;
  pDVar5 = outputs[1];
  if (samples != 0 && *(char *)((long)param + 0x20) != '\0') {
    iVar3 = *(int *)((long)param + 0x10);
    uVar9 = 0;
    do {
      uVar7 = uVar7 + iVar3;
      pDVar4[uVar9] = (int)sVar2 << 7;
      pDVar5[uVar9] = (int)sVar2 << 7;
      if (*(char *)((long)param + 0x60) == '\0') {
        do {
          if ((*(long *)((long)param + 0x48) == 0) || (uVar7 < 0x100000)) break;
          uVar8 = uVar7 >> 0x14;
          if ((int)uVar11 <= (int)(uVar7 >> 0x14)) {
            uVar8 = uVar11;
          }
          bVar6 = true;
          uVar11 = uVar11 - uVar8;
          if (uVar11 == 0) {
            advance_state((upd7759_state *)param);
            if (*(char *)((long)param + 0x20) == '\0') {
              uVar11 = 0;
              bVar6 = false;
            }
            else {
              uVar11 = *(uint *)((long)param + 0x24);
              if (*(char *)((long)param + 0x61) == '\0') {
                sVar2 = *(short *)((long)param + 0x42);
              }
              else {
                sVar2 = 0;
              }
            }
          }
          uVar7 = uVar7 + uVar8 * -0x100000;
        } while (bVar6);
      }
      else {
        iVar10 = 4;
        if ((int)uVar11 < 5) {
          do {
            cVar1 = *(char *)((long)param + 0x17);
            advance_state((upd7759_state *)param);
            if ((cVar1 != *(char *)((long)param + 0x17)) &&
               (*(code **)((long)param + 0x18) != (code *)0x0)) {
              (**(code **)((long)param + 0x18))(param);
            }
            iVar10 = iVar10 - uVar11;
            uVar11 = *(uint *)((long)param + 0x24);
          } while ((iVar10 != 0) && ((int)uVar11 <= iVar10));
        }
        uVar11 = uVar11 - iVar10;
      }
      uVar9 = uVar9 + 1;
    } while (uVar9 != samples);
  }
  uVar8 = samples - (uint)uVar9;
  if ((uint)uVar9 <= samples && uVar8 != 0) {
    __n = (ulong)uVar8 << 2;
    memset(pDVar4 + (uVar9 & 0xffffffff),0,__n);
    memset(pDVar5 + (uVar9 & 0xffffffff),0,__n);
  }
  *(uint *)((long)param + 0x24) = uVar11;
  *(uint *)((long)param + 0xc) = uVar7;
  return;
}

Assistant:

static void upd7759_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	upd7759_state *chip = (upd7759_state *)param;
	UINT32 i;
	INT32 clocks_left = chip->clocks_left;
	INT16 sample = chip->Muted ? 0 : chip->sample;
	UINT32 step = chip->step;
	UINT32 pos = chip->pos;
	DEV_SMPL *buffer = outputs[0];
	DEV_SMPL *buffer2 = outputs[1];

	/* loop until done */
	i = 0;
	if (chip->state != STATE_IDLE)
		for (; i < samples; i++)
		{
			/* store the current sample */
			buffer[i] = sample << 7;
			buffer2[i] = sample << 7;

			/* advance by the number of clocks/output sample */
			pos += step;

			/* handle clocks, but only in standalone mode */
			if (! chip->ChipMode)
			{
				while (chip->rom && pos >= FRAC_ONE)
				{
					int clocks_this_time = pos >> FRAC_BITS;
					if (clocks_this_time > clocks_left)
						clocks_this_time = clocks_left;

					/* clock once */
					pos -= clocks_this_time * FRAC_ONE;
					clocks_left -= clocks_this_time;

					/* if we're out of clocks, time to handle the next state */
					if (clocks_left == 0)
					{
						/* advance one state; if we hit idle, bail */
						advance_state(chip);
						if (chip->state == STATE_IDLE)
							break;

						/* reimport the variables that we cached */
						clocks_left = chip->clocks_left;
						sample = chip->Muted ? 0 : chip->sample;
					}
				}
			}
			else
			{
				// advance the state (4x because of Clock Divider /4)
				INT32 rem_clocks = 4;
				
				while(rem_clocks && clocks_left <= rem_clocks)
				{
					rem_clocks -= clocks_left;
					upd7759_slave_update(chip);
					clocks_left = chip->clocks_left;
				}
				clocks_left -= rem_clocks;
			}
		}

	/* if we got out early, just zap the rest of the buffer */
	if (i < samples)
	{
		samples -= i;
		memset(&buffer[i], 0, samples * sizeof(DEV_SMPL));
		memset(&buffer2[i], 0, samples * sizeof(DEV_SMPL));
	}

	/* flush the state back */
	chip->clocks_left = clocks_left;
	chip->pos = pos;
}